

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.h
# Opt level: O0

void __thiscall
cmCustomCommandGenerator::cmCustomCommandGenerator
          (cmCustomCommandGenerator *this,cmCustomCommandGenerator *param_1)

{
  bool bVar1;
  cmCustomCommandGenerator *param_1_local;
  cmCustomCommandGenerator *this_local;
  
  this->CC = param_1->CC;
  std::__cxx11::string::string((string *)&this->OutputConfig,(string *)&param_1->OutputConfig);
  std::__cxx11::string::string((string *)&this->CommandConfig,(string *)&param_1->CommandConfig);
  std::__cxx11::string::string((string *)&this->Target,(string *)&param_1->Target);
  this->LG = param_1->LG;
  bVar1 = param_1->MakeVars;
  this->OldStyle = param_1->OldStyle;
  this->MakeVars = bVar1;
  cmCustomCommandLines::cmCustomCommandLines(&this->CommandLines,&param_1->CommandLines);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->EmulatorsWithArguments,&param_1->EmulatorsWithArguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Outputs,&param_1->Outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Byproducts,&param_1->Byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends,&param_1->Depends);
  std::__cxx11::string::string
            ((string *)&this->WorkingDirectory,(string *)&param_1->WorkingDirectory);
  std::
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  ::set(&this->Utilities,&param_1->Utilities);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->ComputeInternalDepfile,&param_1->ComputeInternalDepfile);
  return;
}

Assistant:

cmCustomCommandGenerator(cmCustomCommandGenerator&&) = default;